

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.h
# Opt level: O1

ScopeSlots __thiscall Js::SlotArrayVariablesWalker::GetSlotArray(SlotArrayVariablesWalker *this)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  long in_RSI;
  
  pp_Var1 = *(_func_int ***)(in_RSI + 0x10);
  if (pp_Var1 == (_func_int **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/DiagObjectModel.h"
                                ,0x101,"(slotArray != nullptr)","slotArray != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  Memory::Recycler::WBSetBit((char *)this);
  (this->super_VariableWalkerBase).super_IDiagObjectModelWalkerBase._vptr_IDiagObjectModelWalkerBase
       = pp_Var1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  return (ScopeSlots)(Type)this;
}

Assistant:

ScopeSlots GetSlotArray()
        {
            Field(Var) *slotArray = (Field(Var) *) instance;
            Assert(slotArray != nullptr);
            return ScopeSlots(slotArray);
        }